

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

bool __thiscall cmState::Snapshot::RaiseScope(Snapshot *this,string *var,char *varDef)

{
  PositionType *this_00;
  iterator other;
  StackIter begin;
  StackIter end;
  bool bVar1;
  PointerType pSVar2;
  PointerType pSVar3;
  PointerType this_01;
  Snapshot parentDir;
  allocator local_69;
  Snapshot local_68;
  string local_50;
  
  this_00 = &this->Position;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  other.Tree = (pSVar3->DirectoryParent).Tree;
  other.Position = (pSVar3->DirectoryParent).Position;
  bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==(&pSVar2->ScopeParent,other);
  if (bVar1) {
    GetBuildsystemDirectoryParent(&local_68,this);
    bVar1 = IsValid(&local_68);
    if (bVar1) {
      if (varDef == (char *)0x0) {
        RemoveDefinition(&local_68,var);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,varDef,&local_69);
        SetDefinition(&local_68,var,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  else {
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    cmDefinitions::Raise(var,begin,end);
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
    this_01 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar2->Parent);
    cmDefinitions::Set(this_01,var,varDef);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmState::Snapshot::RaiseScope(std::string const& var, const char* varDef)
{
  if(this->Position->ScopeParent == this->Position->DirectoryParent)
    {
    Snapshot parentDir = this->GetBuildsystemDirectoryParent();
    if(!parentDir.IsValid())
      {
      return false;
      }
    // Update the definition in the parent directory top scope.  This
    // directory's scope was initialized by the closure of the parent
    // scope, so we do not need to localize the definition first.
    if (varDef)
      {
      parentDir.SetDefinition(var, varDef);
      }
    else
      {
      parentDir.RemoveDefinition(var);
      }
    return true;
    }
  // First localize the definition in the current scope.
  cmDefinitions::Raise(var, this->Position->Vars,
                       this->Position->Root);

  // Now update the definition in the parent scope.
  this->Position->Parent->Set(var, varDef);
  return true;
}